

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

void __thiscall
icu_63::DateTimePatternGenerator::getAppendName
          (DateTimePatternGenerator *this,UDateTimePatternField field,UnicodeString *value)

{
  short sVar1;
  long lVar2;
  int32_t iVar3;
  UChar local_24;
  UChar local_22;
  
  sVar1 = (value->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (value->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  icu_63::UnicodeString::doReplace(value,0,iVar3,&local_24,0,1);
  lVar2 = (ulong)field * 0xc0;
  if (*(short *)(&this->field_0x510 + lVar2) < 0) {
    iVar3 = *(int32_t *)(&this->field_0x514 + lVar2);
  }
  else {
    iVar3 = (int)*(short *)(&this->field_0x510 + lVar2) >> 5;
  }
  icu_63::UnicodeString::doAppend(value,(UnicodeString *)(&this->field_0x508 + lVar2),0,iVar3);
  icu_63::UnicodeString::doAppend(value,&local_22,0,1);
  return;
}

Assistant:

void
DateTimePatternGenerator::getAppendName(UDateTimePatternField field, UnicodeString& value) {
    value = SINGLE_QUOTE;
    value += fieldDisplayNames[field][UDATPG_WIDTH_APPENDITEM];
    value += SINGLE_QUOTE;
}